

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  char *__s;
  Display *pDVar2;
  unsigned_long uVar3;
  size_t sVar4;
  Atom AVar5;
  Atom AVar6;
  Window WVar7;
  long *plVar8;
  ulong uVar9;
  undefined4 local_138 [2];
  XEvent reply;
  Atom targets [4];
  
  AVar6 = 0;
  uVar9 = 0;
  memset(local_138,0,0xc0);
  AVar5 = _glfw.x11.UTF8_STRING;
  pDVar2 = _glfw.x11.display;
  local_138[0] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_00117b7c;
  AVar6 = (event->xkey).time;
  if (AVar6 == _glfw.x11.TARGETS) {
    plVar8 = reply.pad + 0x17;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = 0x1f;
    WVar7 = (event->xkey).root;
    uVar9 = 4;
    AVar5 = 4;
    reply.pad[0x17] = AVar6;
LAB_00117a6c:
    XChangeProperty(_glfw.x11.display,WVar7,AVar1,AVar5,0x20,0,plVar8,uVar9);
  }
  else {
    __s = *(char **)((long)_glfw.x11.keynames +
                    (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar6 != _glfw.x11.MULTIPLE) {
      if (AVar6 != _glfw.x11.SAVE_TARGETS) {
        if (AVar6 == 0x1f || AVar6 == _glfw.x11.UTF8_STRING) {
          WVar7 = (event->xkey).root;
          sVar4 = strlen(__s);
          XChangeProperty(pDVar2,WVar7,AVar1,AVar6,8,0,__s,sVar4);
          AVar6 = (event->xselectionrequest).property;
        }
        else {
          AVar6 = 0;
        }
        goto LAB_00117b7c;
      }
      WVar7 = (event->xkey).root;
      uVar9 = uVar9 & 0xffffffff00000000;
      plVar8 = (long *)0x0;
      AVar5 = _glfw.x11.NULL_;
      goto LAB_00117a6c;
    }
    uVar3 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)(reply.pad + 0x17));
    for (uVar9 = 0; pDVar2 = _glfw.x11.display, uVar9 < uVar3; uVar9 = uVar9 + 2) {
      AVar1 = *(Atom *)(reply.pad[0x17] + uVar9 * 8);
      if (AVar1 == AVar5 || AVar1 == 0x1f) {
        WVar7 = (event->xkey).root;
        targets[3] = *(Atom *)(reply.pad[0x17] + 8 + uVar9 * 8);
        sVar4 = strlen(__s);
        XChangeProperty(pDVar2,WVar7,targets[3],AVar1,8,0,__s,sVar4);
      }
      else {
        *(undefined8 *)(reply.pad[0x17] + 8 + uVar9 * 8) = 0;
      }
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0);
    XFree(reply.pad[0x17]);
  }
  AVar6 = (event->xselectionrequest).property;
LAB_00117b7c:
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar6;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}